

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.cpp
# Opt level: O0

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::StoreLPToState::operator()
          (StoreLPToState *this,iterator_t *str,iterator_t *end)

{
  POMDPDiscrete *pPVar1;
  ostream *poVar2;
  undefined8 uVar3;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_RSI;
  long *in_RDI;
  stringstream ermsg;
  E e;
  Index sI;
  stringstream ss;
  size_t nrS;
  uint index;
  string *in_stack_fffffffffffffbb8;
  MultiAgentDecisionProcessDiscrete *in_stack_fffffffffffffbc0;
  value_type_conflict1 *in_stack_fffffffffffffbc8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbe8;
  E *in_stack_fffffffffffffbf0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  ulong local_28;
  uint local_1c;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa450e6);
  if (*(int *)(*in_RDI + 0x40) == 2) {
    local_1c = *(uint *)(*in_RDI + 0x10);
    pPVar1 = GetPOMDPDiscrete((ParserPOMDPFormat_Spirit *)*in_RDI);
    local_28 = (**(code **)(*(long *)&(pPVar1->super_DecPOMDPDiscrete).
                                      super_MultiAgentDecisionProcessDiscrete.
                                      super_MultiAgentDecisionProcess + 0x30))();
    if (local_28 <= local_1c) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      poVar2 = std::operator<<(local_1a0,"StoreLPToState: \'");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
      poVar2 = std::operator<<(poVar2,"\' is not a valid state index!? Number of states is ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
      std::operator<<(poVar2," (at ");
      boost::spirit::classic::
      position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
      ::get_position(in_RSI);
      poVar2 = POMDPFormatParsing::operator<<
                         ((ostream *)in_stack_fffffffffffffbc0,
                          (file_position *)in_stack_fffffffffffffbb8);
      poVar2 = std::operator<<(poVar2,")");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      uVar3 = __cxa_allocate_exception(0x28);
      E::E((E *)in_stack_fffffffffffffbc0,(stringstream *)in_stack_fffffffffffffbb8);
      __cxa_throw(uVar3,&E::typeinfo,E::~E);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  }
  else if (*(int *)(*in_RDI + 0x40) == 3) {
    GetPOMDPDiscrete((ParserPOMDPFormat_Spirit *)*in_RDI);
    MultiAgentDecisionProcessDiscrete::GetStateIndexByName
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  }
  else {
    if (*(int *)(*in_RDI + 0x40) != 4) {
      uVar3 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      __cxa_throw(uVar3,&E::typeinfo,E::~E);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  }
  return;
}

Assistant:

void ParserPOMDPFormat_Spirit::StoreLPToState::operator()(iterator_t str, iterator_t end) const
{
    if(DEBUG_POMDP_PARSE)
        cout << "StoreLPToState: pushing "<<string(str,end)<< " on __m_po->_m_lp_sI"<<endl;
    //we are parsing a new to state - the previous is not valid
    //any more, so we clear the state index vector
    _m_po->_m_lp_toSI.clear();
    if(_m_po->_m_lp_type == UINT)
    {
        unsigned int index = _m_po->_m_lp_uint;
        size_t nrS =  _m_po->GetPOMDPDiscrete()->GetNrStates();
        if(index >= nrS)
        {            
            stringstream ss; ss<<"StoreLPToState: '"<< index<< "' is not a valid state index!? Number of states is " << nrS <<" (at " <<str.get_position()<<")"<<endl; throw E(ss);
        }

        _m_po->_m_lp_toSI.push_back( _m_po->_m_lp_uint );
    }
    else if(_m_po->_m_lp_type == STRING)
    {
        try
        {
            Index sI = _m_po->GetPOMDPDiscrete()->GetStateIndexByName(
                _m_po->_m_lp_string);
            _m_po->_m_lp_toSI.push_back(sI);
        }
        catch(E e)
        {
            stringstream ermsg; ermsg << e.SoftPrint() << " (at " << 
                str.get_position() << ")"<<endl;
            throw E(ermsg);
        }
    }
    else if(_m_po->_m_lp_type == ASTERICK )
        _m_po->_m_lp_toSI.push_back(_m_po->_m_anyStateIndex);
    else
        throw E("StoreLPToState expected that the last parsed type is a state index(uint), state name (string) or wilcard ('*').");
}